

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O3

int mbedtls_camellia_setkey_enc(mbedtls_camellia_context *ctx,uchar *key,uint keybits)

{
  uint32_t *__s;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  uchar *puVar9;
  uint *puVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  char cVar14;
  char cVar20;
  char cVar21;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint32_t KC [16];
  uint32_t SIGMA [6] [2];
  uint32_t TK [20];
  uchar t [64];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  mbedtls_camellia_context *local_100;
  uint local_f8 [32];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  __s = ctx->rk;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  memset(__s,0,0x110);
  if ((keybits == 0x100) || (keybits == 0xc0)) {
    ctx->nr = 4;
    memcpy(local_78,key,(ulong)(keybits >> 3));
    iVar8 = 1;
    if (keybits == 0xc0) {
      local_68._8_8_ = ~local_68._0_8_;
    }
  }
  else {
    if (keybits != 0x80) {
      return -0x24;
    }
    ctx->nr = 3;
    memcpy(local_78,key,0x10);
    iVar8 = 0;
  }
  lVar6 = 0;
  do {
    uVar1 = *(uint *)SIGMA_CHARS[lVar6];
    uVar2 = *(uint *)(SIGMA_CHARS[lVar6] + 4);
    local_f8[lVar6 * 2] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    local_f8[lVar6 * 2 + 1] =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  local_118 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  lVar6 = 0;
  do {
    uVar1 = *(uint *)(local_78 + lVar6 * 4);
    *(uint *)(local_148 + lVar6 * 4) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  local_128._4_4_ = local_138._4_4_ ^ local_148._4_4_;
  local_128._0_4_ = local_138._0_4_ ^ local_148._0_4_;
  uStack_120._0_4_ = local_138._8_4_ ^ local_148._8_4_;
  uStack_120._4_4_ = local_138._12_4_ ^ local_148._12_4_;
  local_100 = ctx;
  camellia_feistel((uint32_t *)(ulong)(uint)(local_138._0_4_ ^ local_148._0_4_),
                   (uint32_t *)(ulong)(uint)(local_138._4_4_ ^ local_148._4_4_),
                   (uint32_t *)(ulong)local_f8[0]);
  camellia_feistel((uint32_t *)(ulong)(uint)uStack_120,(uint32_t *)(ulong)uStack_120._4_4_,
                   (uint32_t *)(ulong)local_f8[2]);
  local_128 = local_128 ^ local_148._0_8_;
  uStack_120 = uStack_120 ^ local_148._8_8_;
  camellia_feistel((uint32_t *)(local_128 & 0xffffffff),(uint32_t *)(local_128 >> 0x20),
                   (uint32_t *)(ulong)local_f8[4]);
  camellia_feistel((uint32_t *)(ulong)(uint)uStack_120,(uint32_t *)(ulong)uStack_120._4_4_,
                   (uint32_t *)(ulong)local_f8[6]);
  if (0x80 < keybits) {
    local_118._0_8_ = local_128 ^ local_138._0_8_;
    local_118._8_8_ = uStack_120 ^ local_138._8_8_;
    camellia_feistel((uint32_t *)(local_118._0_8_ & 0xffffffff),
                     (uint32_t *)((ulong)local_118._0_8_ >> 0x20),(uint32_t *)(ulong)local_f8[8]);
    camellia_feistel((uint32_t *)(ulong)(uint)local_118._8_4_,
                     (uint32_t *)(ulong)(uint)local_118._12_4_,(uint32_t *)(ulong)local_f8[10]);
  }
  local_f8[0xc] = local_148._0_4_;
  local_f8[0xd] = local_148._4_4_;
  local_f8[0xe] = local_148._8_4_;
  local_f8[0xf] = local_148._12_4_;
  puVar9 = shifts[0][0] + (uint)(iVar8 << 4);
  lVar6 = 0x1c;
  bVar5 = 0xf;
  do {
    if (*puVar9 != '\0') {
      bVar7 = -(bVar5 & 0x1f);
      *(uint *)((long)local_f8 + lVar6 + 0x24) =
           (uint)local_148._4_4_ >> (bVar7 & 0x1f) ^ local_148._0_4_ << (bVar5 & 0x1f);
      *(uint *)((long)local_f8 + lVar6 + 0x28) =
           (uint)local_148._8_4_ >> (bVar7 & 0x1f) ^ local_148._4_4_ << (bVar5 & 0x1f);
      *(uint *)((long)local_f8 + lVar6 + 0x2c) =
           (uint)local_148._12_4_ >> (bVar7 & 0x1f) ^ local_148._8_4_ << (bVar5 & 0x1f);
      *(uint *)((long)local_f8 + lVar6 + 0x30) =
           (uint)local_148._0_4_ >> (bVar7 & 0x1f) ^ local_148._12_4_ << (bVar5 & 0x1f);
    }
    lVar6 = lVar6 + 0x10;
    puVar9 = puVar9 + 1;
    bVar5 = bVar5 + 0xf;
  } while (lVar6 != 0x5c);
  lVar6 = 0;
  auVar17._8_4_ = 0xffffffff;
  auVar17._0_8_ = 0xffffffffffffffff;
  auVar17._12_4_ = 0xffffffff;
  do {
    uVar1 = *(uint *)(indexes[0][0] + lVar6 + (ulong)(uint)(iVar8 * 0x50));
    cVar14 = (char)uVar1;
    uVar2 = local_f8[lVar6 + 0xd];
    uVar3 = local_f8[lVar6 + 0xe];
    uVar4 = local_f8[lVar6 + 0xf];
    if ((bool)(~(cVar14 == -1) & 1)) {
      __s[cVar14] = local_f8[lVar6 + 0xc];
    }
    cVar20 = (char)(uVar1 >> 8);
    cVar21 = (char)(uVar1 >> 0x10);
    auVar15 = ZEXT316(CONCAT12(-(cVar21 == -1),CONCAT11(-(cVar20 == -1),-(cVar14 == -1)))) << 8 ^
              auVar17;
    if ((auVar15 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      auVar15._4_4_ = uVar2;
      auVar15._0_4_ = uVar2;
      auVar15._8_4_ = uVar2;
      auVar15._12_4_ = uVar2;
      __s[cVar20] = uVar2;
    }
    auVar15 = pshuflw(auVar15,ZEXT416(uVar1),0x55);
    if (auVar15[4] != -1) {
      __s[cVar21] = uVar3;
    }
    cVar14 = (char)(uVar1 >> 0x18);
    if (cVar14 != -1) {
      __s[cVar14] = uVar4;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x14);
  if (0x80 < keybits) {
    puVar10 = local_f8 + 0x13;
    local_f8[0xc] = local_138._0_4_;
    local_f8[0xd] = local_138._4_4_;
    local_f8[0xe] = local_138._8_4_;
    local_f8[0xf] = local_138._12_4_;
    bVar5 = 0xf;
    lVar6 = 0;
    do {
      if (*(char *)((ulong)(uint)(iVar8 << 4) + 0x117084 + lVar6) != '\0') {
        bVar7 = -(bVar5 & 0x1f);
        puVar10[-3] = (uint)local_138._4_4_ >> (bVar7 & 0x1f) ^ local_138._0_4_ << (bVar5 & 0x1f);
        puVar10[-2] = (uint)local_138._8_4_ >> (bVar7 & 0x1f) ^ local_138._4_4_ << (bVar5 & 0x1f);
        puVar10[-1] = (uint)local_138._12_4_ >> (bVar7 & 0x1f) ^ local_138._8_4_ << (bVar5 & 0x1f);
        *puVar10 = (uint)local_138._0_4_ >> (bVar7 & 0x1f) ^ local_138._12_4_ << (bVar5 & 0x1f);
      }
      lVar6 = lVar6 + 1;
      puVar10 = puVar10 + 4;
      bVar5 = bVar5 + 0xf;
    } while (lVar6 != 4);
    lVar6 = 0;
    auVar11._8_4_ = 0xffffffff;
    auVar11._0_8_ = 0xffffffffffffffff;
    auVar11._12_4_ = 0xffffffff;
    do {
      uVar1 = *(uint *)((ulong)(uint)(iVar8 * 0x50) + 0x1167f4 + lVar6);
      cVar14 = (char)uVar1;
      uVar2 = local_f8[lVar6 + 0xd];
      uVar3 = local_f8[lVar6 + 0xe];
      uVar4 = local_f8[lVar6 + 0xf];
      if ((bool)(~(cVar14 == -1) & 1)) {
        __s[cVar14] = local_f8[lVar6 + 0xc];
      }
      cVar20 = (char)(uVar1 >> 8);
      cVar21 = (char)(uVar1 >> 0x10);
      auVar16 = ZEXT316(CONCAT12(-(cVar21 == -1),CONCAT11(-(cVar20 == -1),-(cVar14 == -1)))) << 8 ^
                auVar11;
      if ((auVar16 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        auVar16._4_4_ = uVar2;
        auVar16._0_4_ = uVar2;
        auVar16._8_4_ = uVar2;
        auVar16._12_4_ = uVar2;
        __s[cVar20] = uVar2;
      }
      auVar17 = pshuflw(auVar16,ZEXT416(uVar1),0x55);
      if (auVar17[4] != -1) {
        __s[cVar21] = uVar3;
      }
      cVar14 = (char)(uVar1 >> 0x18);
      if (cVar14 != -1) {
        __s[cVar14] = uVar4;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x14);
  }
  local_f8[0xc] = (uint)local_128;
  local_f8[0xd] = local_128._4_4_;
  local_f8[0xe] = (uint)uStack_120;
  local_f8[0xf] = uStack_120._4_4_;
  puVar9 = shifts[0][2] + (uint)(iVar8 << 4);
  lVar6 = 0x1c;
  bVar5 = 0xf;
  do {
    if (*puVar9 != '\0') {
      bVar7 = -(bVar5 & 0x1f);
      *(uint *)((long)local_f8 + lVar6 + 0x24) =
           local_128._4_4_ >> (bVar7 & 0x1f) ^ (uint)local_128 << (bVar5 & 0x1f);
      *(uint *)((long)local_f8 + lVar6 + 0x28) =
           (uint)uStack_120 >> (bVar7 & 0x1f) ^ local_128._4_4_ << (bVar5 & 0x1f);
      *(uint *)((long)local_f8 + lVar6 + 0x2c) =
           uStack_120._4_4_ >> (bVar7 & 0x1f) ^ (uint)uStack_120 << (bVar5 & 0x1f);
      *(uint *)((long)local_f8 + lVar6 + 0x30) =
           (uint)local_128 >> (bVar7 & 0x1f) ^ uStack_120._4_4_ << (bVar5 & 0x1f);
    }
    lVar6 = lVar6 + 0x10;
    puVar9 = puVar9 + 1;
    bVar5 = bVar5 + 0xf;
  } while (lVar6 != 0x5c);
  lVar6 = 0;
  auVar12._8_4_ = 0xffffffff;
  auVar12._0_8_ = 0xffffffffffffffff;
  auVar12._12_4_ = 0xffffffff;
  do {
    uVar1 = *(uint *)((ulong)(uint)(iVar8 * 0x50) + 0x116808 + lVar6);
    cVar14 = (char)uVar1;
    uVar2 = local_f8[lVar6 + 0xd];
    uVar3 = local_f8[lVar6 + 0xe];
    uVar4 = local_f8[lVar6 + 0xf];
    if ((bool)(~(cVar14 == -1) & 1)) {
      __s[cVar14] = local_f8[lVar6 + 0xc];
    }
    cVar20 = (char)(uVar1 >> 8);
    cVar21 = (char)(uVar1 >> 0x10);
    auVar18 = ZEXT316(CONCAT12(-(cVar21 == -1),CONCAT11(-(cVar20 == -1),-(cVar14 == -1)))) << 8 ^
              auVar12;
    if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      auVar18._4_4_ = uVar2;
      auVar18._0_4_ = uVar2;
      auVar18._8_4_ = uVar2;
      auVar18._12_4_ = uVar2;
      __s[cVar20] = uVar2;
    }
    auVar17 = pshuflw(auVar18,ZEXT416(uVar1),0x55);
    if (auVar17[4] != -1) {
      __s[cVar21] = uVar3;
    }
    cVar14 = (char)(uVar1 >> 0x18);
    if (cVar14 != -1) {
      __s[cVar14] = uVar4;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x14);
  if (0x80 < keybits) {
    puVar10 = local_f8 + 0x13;
    local_f8[0xc] = local_118._0_4_;
    local_f8[0xd] = local_118._4_4_;
    local_f8[0xe] = local_118._8_4_;
    local_f8[0xf] = local_118._12_4_;
    bVar5 = 0xf;
    lVar6 = 0;
    do {
      if (*(char *)((ulong)(uint)(iVar8 << 4) + 0x11708c + lVar6) != '\0') {
        bVar7 = -(bVar5 & 0x1f);
        puVar10[-3] = (uint)local_118._4_4_ >> (bVar7 & 0x1f) ^ local_118._0_4_ << (bVar5 & 0x1f);
        puVar10[-2] = (uint)local_118._8_4_ >> (bVar7 & 0x1f) ^ local_118._4_4_ << (bVar5 & 0x1f);
        puVar10[-1] = (uint)local_118._12_4_ >> (bVar7 & 0x1f) ^ local_118._8_4_ << (bVar5 & 0x1f);
        *puVar10 = (uint)local_118._0_4_ >> (bVar7 & 0x1f) ^ local_118._12_4_ << (bVar5 & 0x1f);
      }
      lVar6 = lVar6 + 1;
      puVar10 = puVar10 + 4;
      bVar5 = bVar5 + 0xf;
    } while (lVar6 != 4);
    lVar6 = 0;
    auVar13._8_4_ = 0xffffffff;
    auVar13._0_8_ = 0xffffffffffffffff;
    auVar13._12_4_ = 0xffffffff;
    do {
      uVar1 = *(uint *)((ulong)(uint)(iVar8 * 0x50) + 0x11681c + lVar6);
      cVar14 = (char)uVar1;
      uVar2 = local_f8[lVar6 + 0xd];
      uVar3 = local_f8[lVar6 + 0xe];
      uVar4 = local_f8[lVar6 + 0xf];
      if ((bool)(~(cVar14 == -1) & 1)) {
        __s[cVar14] = local_f8[lVar6 + 0xc];
      }
      cVar20 = (char)(uVar1 >> 8);
      cVar21 = (char)(uVar1 >> 0x10);
      auVar19 = ZEXT316(CONCAT12(-(cVar21 == -1),CONCAT11(-(cVar20 == -1),-(cVar14 == -1)))) << 8 ^
                auVar13;
      if ((auVar19 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        auVar19._4_4_ = uVar2;
        auVar19._0_4_ = uVar2;
        auVar19._8_4_ = uVar2;
        auVar19._12_4_ = uVar2;
        __s[cVar20] = uVar2;
      }
      auVar17 = pshuflw(auVar19,ZEXT416(uVar1),0x55);
      if (auVar17[4] != -1) {
        __s[cVar21] = uVar3;
      }
      cVar14 = (char)(uVar1 >> 0x18);
      if (cVar14 != -1) {
        __s[cVar14] = uVar4;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x14);
  }
  lVar6 = 0;
  do {
    if ((long)transposes[0][(ulong)(uint)(iVar8 << 2) * 5 + lVar6] != -1) {
      *(uint32_t *)((long)local_100->rk + lVar6 * 4 + (ulong)(uint)(iVar8 * 0x30) + 0x80) =
           __s[transposes[0][(ulong)(uint)(iVar8 << 2) * 5 + lVar6]];
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x14);
  return 0;
}

Assistant:

int mbedtls_camellia_setkey_enc( mbedtls_camellia_context *ctx,
                                 const unsigned char *key,
                                 unsigned int keybits )
{
    int idx;
    size_t i;
    uint32_t *RK;
    unsigned char t[64];
    uint32_t SIGMA[6][2];
    uint32_t KC[16];
    uint32_t TK[20];

    CAMELLIA_VALIDATE_RET( ctx != NULL );
    CAMELLIA_VALIDATE_RET( key != NULL );

    RK = ctx->rk;

    memset( t, 0, 64 );
    memset( RK, 0, sizeof(ctx->rk) );

    switch( keybits )
    {
        case 128: ctx->nr = 3; idx = 0; break;
        case 192:
        case 256: ctx->nr = 4; idx = 1; break;
        default : return( MBEDTLS_ERR_CAMELLIA_BAD_INPUT_DATA );
    }

    for( i = 0; i < keybits / 8; ++i )
        t[i] = key[i];

    if( keybits == 192 ) {
        for( i = 0; i < 8; i++ )
            t[24 + i] = ~t[16 + i];
    }

    /*
     * Prepare SIGMA values
     */
    for( i = 0; i < 6; i++ ) {
        GET_UINT32_BE( SIGMA[i][0], SIGMA_CHARS[i], 0 );
        GET_UINT32_BE( SIGMA[i][1], SIGMA_CHARS[i], 4 );
    }

    /*
     * Key storage in KC
     * Order: KL, KR, KA, KB
     */
    memset( KC, 0, sizeof(KC) );

    /* Store KL, KR */
    for( i = 0; i < 8; i++ )
        GET_UINT32_BE( KC[i], t, i * 4 );

    /* Generate KA */
    for( i = 0; i < 4; ++i )
        KC[8 + i] = KC[i] ^ KC[4 + i];

    camellia_feistel( KC + 8, SIGMA[0], KC + 10 );
    camellia_feistel( KC + 10, SIGMA[1], KC + 8 );

    for( i = 0; i < 4; ++i )
        KC[8 + i] ^= KC[i];

    camellia_feistel( KC + 8, SIGMA[2], KC + 10 );
    camellia_feistel( KC + 10, SIGMA[3], KC + 8 );

    if( keybits > 128 ) {
        /* Generate KB */
        for( i = 0; i < 4; ++i )
            KC[12 + i] = KC[4 + i] ^ KC[8 + i];

        camellia_feistel( KC + 12, SIGMA[4], KC + 14 );
        camellia_feistel( KC + 14, SIGMA[5], KC + 12 );
    }

    /*
     * Generating subkeys
     */

    /* Manipulating KL */
    SHIFT_AND_PLACE( idx, 0 );

    /* Manipulating KR */
    if( keybits > 128 ) {
        SHIFT_AND_PLACE( idx, 1 );
    }

    /* Manipulating KA */
    SHIFT_AND_PLACE( idx, 2 );

    /* Manipulating KB */
    if( keybits > 128 ) {
        SHIFT_AND_PLACE( idx, 3 );
    }

    /* Do transpositions */
    for( i = 0; i < 20; i++ ) {
        if( transposes[idx][i] != -1 ) {
            RK[32 + 12 * idx + i] = RK[transposes[idx][i]];
        }
    }

    return( 0 );
}